

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O1

void Io_WriteBlifSpecial(Abc_Ntk_t *pNtk,char *FileName,char *pLutStruct,int fUseHie)

{
  Abc_Ntk_t *pNtk_00;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioWriteBlif.c"
                  ,0x56c,"void Io_WriteBlifSpecial(Abc_Ntk_t *, char *, char *, int)");
  }
  Abc_NtkToSop(pNtk,-1,1000000000);
  pNtk_00 = Abc_NtkToNetlist(pNtk);
  if (pNtk_00 != (Abc_Ntk_t *)0x0) {
    Io_WriteBlifInt(pNtk_00,FileName,pLutStruct,(uint)(fUseHie != 0 && pLutStruct != (char *)0x0));
    Abc_NtkDelete(pNtk_00);
    return;
  }
  fwrite("Writing BLIF has failed.\n",0x19,1,_stdout);
  return;
}

Assistant:

void Io_WriteBlifSpecial( Abc_Ntk_t * pNtk, char * FileName, char * pLutStruct, int fUseHie )
{
    Abc_Ntk_t * pNtkTemp;
    assert( Abc_NtkIsLogic(pNtk) );
    Abc_NtkToSop( pNtk, -1, ABC_INFINITY );
    // derive the netlist
    pNtkTemp = Abc_NtkToNetlist(pNtk);
    if ( pNtkTemp == NULL )
    {
        fprintf( stdout, "Writing BLIF has failed.\n" );
        return;
    }
    if ( pLutStruct && fUseHie )
        Io_WriteBlifInt( pNtkTemp, FileName, pLutStruct, 1 );
    else
        Io_WriteBlifInt( pNtkTemp, FileName, pLutStruct, 0 );
    Abc_NtkDelete( pNtkTemp );
}